

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  RegularExpression *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string line;
  string local_50;
  
  this_00 = &this->cmDefineRegex;
  pcVar2 = (input->_M_dataplus)._M_p;
  for (pcVar3 = pcVar2; pcVar4 = pcVar3, pcVar3 != pcVar2 + input->_M_string_length;
      pcVar3 = pcVar4 + (pcVar4 != pcVar3)) {
    for (; (pcVar4 != pcVar2 + input->_M_string_length && (*pcVar4 != '\n')); pcVar4 = pcVar4 + 1) {
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&line,pcVar3,pcVar4);
    pcVar3 = (input->_M_dataplus)._M_p + input->_M_string_length;
    bVar1 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_50,this_00,1);
      pcVar2 = GetDefinition(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = cmSystemTools::IsOff(pcVar2);
      if (bVar1) {
        std::__cxx11::string::append((char *)output);
        cmsys::RegularExpression::match_abi_cxx11_(&local_50,this_00,1);
        std::__cxx11::string::append((string *)output);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::append((char *)output);
      }
      else {
        cmsys::SystemTools::ReplaceString(&line,"#cmakedefine","#define");
        std::__cxx11::string::append((string *)output);
      }
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->cmDefine01Regex,line._M_dataplus._M_p);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->cmDefine01Regex,1);
        pcVar2 = GetDefinition(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmsys::SystemTools::ReplaceString(&line,"#cmakedefine01","#define");
        std::__cxx11::string::append((string *)output);
        cmSystemTools::IsOff(pcVar2);
        std::__cxx11::string::append((char *)output);
      }
      else {
        std::__cxx11::string::append((string *)output);
      }
    }
    if (pcVar4 != pcVar3) {
      std::__cxx11::string::append((char *)output);
    }
    std::__cxx11::string::~string((string *)&line);
    pcVar2 = (input->_M_dataplus)._M_p;
  }
  ExpandVariablesInString(this,output,escapeQuotes,true,atOnly,(char *)0x0,-1,true,true);
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input,
                                 std::string& output, bool atOnly,
                                 bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while(lineStart != input.end())
    {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while(lineEnd != input.end() && *lineEnd != '\n')
      {
      ++lineEnd;
      }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if(haveNewline)
      {
      ++lineEnd;
      }

    // Replace #cmakedefine instances.
    if(this->cmDefineRegex.find(line))
      {
      const char* def =
        this->GetDefinition(this->cmDefineRegex.match(1));
      if(!cmSystemTools::IsOff(def))
        {
        cmSystemTools::ReplaceString(line, "#cmakedefine", "#define");
        output += line;
        }
      else
        {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(1);
        output += " */";
        }
      }
    else if(this->cmDefine01Regex.find(line))
      {
      const char* def =
        this->GetDefinition(this->cmDefine01Regex.match(1));
      cmSystemTools::ReplaceString(line, "#cmakedefine01", "#define");
      output += line;
      if(!cmSystemTools::IsOff(def))
        {
        output += " 1";
        }
      else
        {
        output += " 0";
        }
      }
    else
      {
      output += line;
      }

    if(haveNewline)
      {
      output += "\n";
      }

    // Move to the next line.
    lineStart = lineEnd;
    }

  // Perform variable replacements.
  this->ExpandVariablesInString(output, escapeQuotes, true,
                                atOnly, 0, -1, true, true);
}